

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_3dPoint * __thiscall
ON_Xform::operator*(ON_3dPoint *__return_storage_ptr__,ON_Xform *this,ON_3dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  
  dVar1 = p->x;
  dVar2 = p->y;
  dVar3 = p->z;
  dVar5 = dVar3 * this->m_xform[3][2] + dVar1 * this->m_xform[3][0] + dVar2 * this->m_xform[3][1] +
          this->m_xform[3][3];
  uVar4 = -(ulong)(dVar5 != 0.0);
  dVar5 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)(1.0 / dVar5) & uVar4);
  ON_3dPoint::ON_3dPoint
            (__return_storage_ptr__,
             (this->m_xform[0][2] * dVar3 +
              this->m_xform[0][0] * dVar1 + this->m_xform[0][1] * dVar2 + this->m_xform[0][3]) *
             dVar5,(this->m_xform[1][2] * dVar3 +
                    this->m_xform[1][0] * dVar1 + this->m_xform[1][1] * dVar2 + this->m_xform[1][3])
                   * dVar5,
             dVar5 * (this->m_xform[2][2] * dVar3 +
                      this->m_xform[2][0] * dVar1 + this->m_xform[2][1] * dVar2 +
                     this->m_xform[2][3]));
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Xform::operator*( const ON_3dPoint& p ) const
{
  // Note well: The right hand column and bottom row have an important effect 
  // when transforming a Euclidean point and have no effect when transforming a vector. 
  // Be sure you understand the differences between vectors and points when applying a 4x4 transformation.
  const double x = p.x; // optimizer should put x,y,z in registers
  const double y = p.y;
  const double z = p.z;
  double xh[3], w;
  const double* m = &m_xform[0][0];
  xh[0] = m[ 0]*x + m[ 1]*y + m[ 2]*z + m[ 3];
  xh[1] = m[ 4]*x + m[ 5]*y + m[ 6]*z + m[ 7];
  xh[2] = m[ 8]*x + m[ 9]*y + m[10]*z + m[11];
  w     = m[12]*x + m[13]*y + m[14]*z + m[15];
  w = (w != 0.0) ? 1.0/w : 1.0;
  return ON_3dPoint( w*xh[0], w*xh[1], w*xh[2] );
}